

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_lsrkstep.c
# Opt level: O2

int lsrkStep_TakeStepSSP43(ARKodeMem ark_mem,sunrealtype *dsmPtr,int *nflagPtr)

{
  sunrealtype *psVar1;
  N_Vector *pp_Var2;
  sunrealtype sVar3;
  int iVar4;
  int iVar5;
  ARKodeLSRKStepMem in_RAX;
  ARKodeLSRKStepMem step_mem;
  
  *nflagPtr = 0;
  *dsmPtr = 0.0;
  step_mem = in_RAX;
  iVar4 = lsrkStep_AccessStepMem(ark_mem,"lsrkStep_TakeStepSSP43",&step_mem);
  if (iVar4 == 0) {
    psVar1 = step_mem->cvals;
    pp_Var2 = step_mem->Xvecs;
    if (ark_mem->fn_is_current == 0) {
      iVar4 = (*step_mem->fe)(ark_mem->tn,ark_mem->yn,ark_mem->fn,ark_mem->user_data);
      step_mem->nfe = step_mem->nfe + 1;
      ark_mem->fn_is_current = 1;
      if (iVar4 != 0) {
        return -8;
      }
    }
    N_VLinearSum(0,ark_mem->h * 0.5,ark_mem->yn,ark_mem->fn,ark_mem->ycur);
    if (ark_mem->fixedstep == 0) {
      N_VLinearSum(0,ark_mem->h * 0.25,ark_mem->yn,ark_mem->fn,ark_mem->tempv1);
    }
    iVar4 = -0x26;
    if ((ark_mem->ProcessStage == (ARKPostProcessFn)0x0) ||
       (iVar5 = (*ark_mem->ProcessStage)
                          (ark_mem->h * 0.5 + ark_mem->tn,ark_mem->ycur,ark_mem->user_data),
       iVar5 == 0)) {
      iVar4 = (*step_mem->fe)(ark_mem->h * 0.5 + ark_mem->tcur,ark_mem->ycur,ark_mem->tempv3,
                              ark_mem->user_data);
      step_mem->nfe = step_mem->nfe + 1;
      if (-1 < iVar4) {
        if (iVar4 != 0) {
          return 9;
        }
        N_VLinearSum(0,ark_mem->h * 0.5,ark_mem->ycur,ark_mem->tempv3,ark_mem->ycur);
        if (ark_mem->fixedstep == 0) {
          N_VLinearSum(0,ark_mem->h * 0.25,ark_mem->tempv1,ark_mem->tempv3,ark_mem->tempv1);
        }
        if ((ark_mem->ProcessStage != (ARKPostProcessFn)0x0) &&
           (iVar4 = (*ark_mem->ProcessStage)
                              (ark_mem->tcur + ark_mem->h,ark_mem->ycur,ark_mem->user_data),
           iVar4 != 0)) {
          return -0x26;
        }
        iVar4 = (*step_mem->fe)(ark_mem->tcur + ark_mem->h,ark_mem->ycur,ark_mem->tempv3,
                                ark_mem->user_data);
        step_mem->nfe = step_mem->nfe + 1;
        if (-1 < iVar4) {
          if (iVar4 != 0) {
            return 9;
          }
          *pp_Var2 = ark_mem->ycur;
          *psVar1 = 0.3333333333333333;
          psVar1[1] = 0.6666666666666666;
          pp_Var2[1] = ark_mem->yn;
          psVar1[2] = ark_mem->h * 0.16666666666666666;
          pp_Var2[2] = ark_mem->tempv3;
          iVar4 = N_VLinearCombination(3,psVar1,pp_Var2,ark_mem->ycur);
          if (iVar4 != 0) {
            return -0x1c;
          }
          if (ark_mem->fixedstep == 0) {
            N_VLinearSum(0,ark_mem->h * 0.25,ark_mem->tempv1,ark_mem->tempv3,ark_mem->tempv1);
          }
          if ((ark_mem->ProcessStage != (ARKPostProcessFn)0x0) &&
             (iVar4 = (*ark_mem->ProcessStage)
                                (ark_mem->h * 0.5 + ark_mem->tcur,ark_mem->ycur,ark_mem->user_data),
             iVar4 != 0)) {
            return -0x26;
          }
          iVar4 = (*step_mem->fe)(ark_mem->h * 0.5 + ark_mem->tcur,ark_mem->ycur,ark_mem->tempv3,
                                  ark_mem->user_data);
          step_mem->nfe = step_mem->nfe + 1;
          if (iVar4 < 0) {
            return -8;
          }
          if (iVar4 != 0) {
            return 9;
          }
          N_VLinearSum(0,ark_mem->h * 0.5,ark_mem->ycur,ark_mem->tempv3,ark_mem->ycur);
          if (ark_mem->fixedstep != 0) {
            return 0;
          }
          N_VLinearSum(0,ark_mem->h * 0.25,ark_mem->tempv1,ark_mem->tempv3,ark_mem->tempv1);
          N_VLinearSum(0,0xbff0000000000000,ark_mem->ycur,ark_mem->tempv1);
          sVar3 = (sunrealtype)N_VWrmsNorm(ark_mem->tempv1,ark_mem->ewt);
          *dsmPtr = sVar3;
          return 0;
        }
      }
      iVar4 = -8;
    }
  }
  return iVar4;
}

Assistant:

int lsrkStep_TakeStepSSP43(ARKodeMem ark_mem, sunrealtype* dsmPtr, int* nflagPtr)
{
  int retval;
  ARKodeLSRKStepMem step_mem;

  /* initialize algebraic solver convergence flag to success,
     temporal error estimate to zero */
  *nflagPtr = ARK_SUCCESS;
  *dsmPtr   = ZERO;

  /* access ARKodeLSRKStepMem structure */
  retval = lsrkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  sunrealtype* cvals = step_mem->cvals;
  N_Vector* Xvecs    = step_mem->Xvecs;

  sunrealtype rs = SUN_RCONST(4.0);
  sunrealtype p5 = SUN_RCONST(0.5);

  SUNLogInfo(ARK_LOGGER, "begin-stage", "stage = %i, tcur = " SUN_FORMAT_G, 0,
             ark_mem->tcur);
  SUNLogExtraDebugVec(ARK_LOGGER, "stage", ark_mem->yn, "z_0(:) =");

  /* The method is not FSAL. Therefore, fn ​is computed at the beginning
     of the step unless ARKODE updated fn. */
  if (!ark_mem->fn_is_current)
  {
    retval = step_mem->fe(ark_mem->tn, ark_mem->yn, ark_mem->fn,
                          ark_mem->user_data);
    step_mem->nfe++;
    ark_mem->fn_is_current = SUNTRUE;
    if (retval != ARK_SUCCESS)
    {
      SUNLogExtraDebugVec(ARK_LOGGER, "stage RHS", ark_mem->fn, "F_0(:) =");
      SUNLogInfo(ARK_LOGGER, "end-stage",
                 "status = failed rhs eval, retval = %i", retval);
      return (ARK_RHSFUNC_FAIL);
    }
  }

  SUNLogExtraDebugVec(ARK_LOGGER, "stage RHS", ark_mem->fn, "F_0(:) =");
  SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");
  SUNLogInfo(ARK_LOGGER, "begin-stage", "stage = %i, tcur = " SUN_FORMAT_G, 1,
             ark_mem->tn + p5 * ark_mem->h);

  N_VLinearSum(ONE, ark_mem->yn, ark_mem->h * p5, ark_mem->fn, ark_mem->ycur);
  if (!ark_mem->fixedstep)
  {
    N_VLinearSum(ONE, ark_mem->yn, ark_mem->h / rs, ark_mem->fn, ark_mem->tempv1);
  }

  /* apply user-supplied stage postprocessing function (if supplied) */
  if (ark_mem->ProcessStage != NULL)
  {
    retval = ark_mem->ProcessStage(ark_mem->tn + ark_mem->h * p5, ark_mem->ycur,
                                   ark_mem->user_data);
    if (retval != 0)
    {
      SUNLogInfo(ARK_LOGGER, "end-stage",
                 "status = failed postprocess stage, retval = %i", retval);
      return ARK_POSTPROCESS_STAGE_FAIL;
    }
  }

  retval = step_mem->fe(ark_mem->tcur + ark_mem->h * p5, ark_mem->ycur,
                        ark_mem->tempv3, ark_mem->user_data);
  step_mem->nfe++;

  SUNLogExtraDebugVec(ARK_LOGGER, "stage RHS", ark_mem->tempv3, "F_1(:) =");
  SUNLogInfoIf(retval != 0, ARK_LOGGER, "end-stage",
               "status = failed rhs eval, retval = %i", retval);

  if (retval < 0) { return ARK_RHSFUNC_FAIL; }
  if (retval > 0) { return RHSFUNC_RECVR; }

  SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");
  SUNLogInfo(ARK_LOGGER, "begin-stage", "stage = %i, tcur = " SUN_FORMAT_G, 2,
             ark_mem->tn + ark_mem->h);

  N_VLinearSum(ONE, ark_mem->ycur, ark_mem->h * p5, ark_mem->tempv3,
               ark_mem->ycur);
  if (!ark_mem->fixedstep)
  {
    N_VLinearSum(ONE, ark_mem->tempv1, ark_mem->h / rs, ark_mem->tempv3,
                 ark_mem->tempv1);
  }

  /* apply user-supplied stage postprocessing function (if supplied) */
  if (ark_mem->ProcessStage != NULL)
  {
    retval = ark_mem->ProcessStage(ark_mem->tcur + ark_mem->h, ark_mem->ycur,
                                   ark_mem->user_data);
    if (retval != 0)
    {
      SUNLogInfo(ARK_LOGGER, "end-stage",
                 "status = failed postprocess stage, retval = %i", retval);
      return ARK_POSTPROCESS_STAGE_FAIL;
    }
  }

  retval = step_mem->fe(ark_mem->tcur + ark_mem->h, ark_mem->ycur,
                        ark_mem->tempv3, ark_mem->user_data);
  step_mem->nfe++;

  SUNLogExtraDebugVec(ARK_LOGGER, "stage RHS", ark_mem->tempv3, "F_2(:) =");
  SUNLogInfoIf(retval != 0, ARK_LOGGER, "end-stage",
               "status = failed rhs eval, retval = %i", retval);

  if (retval < 0) { return ARK_RHSFUNC_FAIL; }
  if (retval > 0) { return RHSFUNC_RECVR; }

  SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");
  SUNLogInfo(ARK_LOGGER, "begin-stage", "stage = %i, tcur = " SUN_FORMAT_G, 3,
             ark_mem->tn + p5 * ark_mem->h);

  cvals[0] = ONE / THREE;
  Xvecs[0] = ark_mem->ycur;
  cvals[1] = TWO / THREE;
  Xvecs[1] = ark_mem->yn;
  cvals[2] = ONE / SIX * ark_mem->h;
  Xvecs[2] = ark_mem->tempv3;

  retval = N_VLinearCombination(3, cvals, Xvecs, ark_mem->ycur);
  if (retval != 0)
  {
    SUNLogInfo(ARK_LOGGER, "end-stage",
               "status = failed vector op, retval = %i", retval);
    return ARK_VECTOROP_ERR;
  }

  if (!ark_mem->fixedstep)
  {
    N_VLinearSum(ONE, ark_mem->tempv1, ark_mem->h / rs, ark_mem->tempv3,
                 ark_mem->tempv1);
  }

  /* apply user-supplied stage postprocessing function (if supplied) */
  if (ark_mem->ProcessStage != NULL)
  {
    retval = ark_mem->ProcessStage(ark_mem->tcur + ark_mem->h * p5,
                                   ark_mem->ycur, ark_mem->user_data);
    if (retval != 0)
    {
      SUNLogInfo(ARK_LOGGER, "end-stage",
                 "status = failed postprocess stage, retval = %i", retval);
      return ARK_POSTPROCESS_STAGE_FAIL;
    }
  }

  retval = step_mem->fe(ark_mem->tcur + ark_mem->h * p5, ark_mem->ycur,
                        ark_mem->tempv3, ark_mem->user_data);
  step_mem->nfe++;

  SUNLogExtraDebugVec(ARK_LOGGER, "stage RHS", ark_mem->tempv3, "F_3(:) =");
  SUNLogInfoIf(retval != 0, ARK_LOGGER, "end-stage",
               "status = failed rhs eval, retval = %i", retval);

  if (retval < 0) { return ARK_RHSFUNC_FAIL; }
  if (retval > 0) { return RHSFUNC_RECVR; }

  SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");
  SUNLogInfo(ARK_LOGGER, "begin-stage", "stage = %i, tcur = " SUN_FORMAT_G,
             step_mem->req_stages, ark_mem->tn + ark_mem->h);

  N_VLinearSum(ONE, ark_mem->ycur, ark_mem->h * p5, ark_mem->tempv3,
               ark_mem->ycur);

  SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");
  SUNLogExtraDebugVec(ARK_LOGGER, "updated solution", ark_mem->ycur, "ycur(:) =");

  /* Compute yerr (if step adaptivity enabled) */
  if (!ark_mem->fixedstep)
  {
    N_VLinearSum(ONE, ark_mem->tempv1, ark_mem->h / rs, ark_mem->tempv3,
                 ark_mem->tempv1);
    SUNLogExtraDebugVec(ARK_LOGGER, "embedded solution", ark_mem->tempv1,
                        "y_embedded(:) =");

    N_VLinearSum(ONE, ark_mem->ycur, -ONE, ark_mem->tempv1, ark_mem->tempv1);
    *dsmPtr = N_VWrmsNorm(ark_mem->tempv1, ark_mem->ewt);
  }

  return ARK_SUCCESS;
}